

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O3

void HAXX::
     TPACK<2ul,HAXX::quaternion<double>,HAXX::GenericPackOps_T1<HAXX::quaternion<double>,HAXX::AVXType<double>>,std::complex<double>>
               (int32_t M,int32_t N,quaternion<double> *X,int32_t LDX,quaternion<double> *Xp,
               complex<double> args)

{
  quaternion<double> *pqVar1;
  double *pdVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  quaternion<double> qVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  quaternion<double> *pqVar11;
  undefined1 auVar12 [32];
  undefined1 in_ZMM0 [64];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  quaternion<double> qVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  
  auVar6 = vunpcklpd_avx(in_ZMM0._0_16_,in_ZMM1._0_16_);
  auVar12._16_16_ = auVar6;
  auVar12._0_16_ = auVar6;
  auVar12 = vshufpd_avx(auVar12,auVar12,5);
  dVar13 = auVar12._0_8_;
  dVar14 = -auVar12._8_8_;
  dVar15 = auVar12._16_8_;
  dVar16 = -auVar12._24_8_;
  dVar4 = auVar6._8_8_;
  dVar5 = auVar6._0_8_;
  if (0 < N >> 1) {
    iVar8 = N >> 1;
    do {
      pqVar11 = X;
      iVar10 = M;
      if (0 < M) {
        do {
          auVar19._0_8_ = pqVar11->_M_real * dVar5;
          auVar19._8_8_ = pqVar11->_M_imag_i * dVar4;
          auVar19._16_8_ = pqVar11->_M_imag_j * dVar5;
          auVar19._24_8_ = pqVar11->_M_imag_k * dVar4;
          auVar17._0_8_ = pqVar11->_M_real * dVar13;
          auVar17._8_8_ = pqVar11->_M_imag_i * dVar14;
          auVar17._16_8_ = pqVar11->_M_imag_j * dVar15;
          auVar17._24_8_ = pqVar11->_M_imag_k * dVar16;
          auVar12 = vhsubpd_avx(auVar19,auVar17);
          pqVar1 = pqVar11 + LDX;
          auVar23._0_8_ = pqVar1->_M_real * dVar5;
          auVar23._8_8_ = pqVar1->_M_imag_i * dVar4;
          auVar23._16_8_ = pqVar1->_M_imag_j * dVar5;
          auVar23._24_8_ = pqVar1->_M_imag_k * dVar4;
          auVar20._0_8_ = dVar13 * pqVar1->_M_real;
          auVar20._8_8_ = dVar14 * pqVar1->_M_imag_i;
          auVar20._16_8_ = dVar15 * pqVar1->_M_imag_j;
          auVar20._24_8_ = dVar16 * pqVar1->_M_imag_k;
          auVar17 = vhsubpd_avx(auVar23,auVar20);
          qVar24._M_imag_j = (double)SUB168(auVar17._0_16_,0);
          qVar24._M_imag_k = (double)SUB168(auVar17._0_16_,8);
          qVar24._M_real = (double)SUB168(auVar12._0_16_,0);
          qVar24._M_imag_i = (double)SUB168(auVar12._0_16_,8);
          qVar7 = (quaternion<double>)vperm2f128_avx(auVar12,auVar17,0x31);
          *Xp = qVar24;
          Xp[1] = qVar7;
          Xp = Xp + 2;
          iVar10 = iVar10 + -1;
          pqVar11 = pqVar11 + 1;
        } while (iVar10 != 0);
      }
      X = X + (long)LDX * 2;
      bVar3 = 1 < iVar8;
      iVar8 = iVar8 + -1;
    } while (bVar3);
  }
  if (0 < M && (N & 1U) != 0) {
    lVar9 = 0;
    auVar21._0_8_ = dVar5 * 0.0;
    auVar21._8_8_ = dVar4 * 0.0;
    auVar21._16_8_ = dVar5 * 0.0;
    auVar21._24_8_ = dVar4 * 0.0;
    auVar18._0_8_ = dVar13 * 0.0;
    auVar18._8_8_ = dVar14 * 0.0;
    auVar18._16_8_ = dVar15 * 0.0;
    auVar18._24_8_ = dVar16 * 0.0;
    auVar12 = vhsubpd_avx(auVar21,auVar18);
    do {
      pdVar2 = (double *)((long)&X->_M_real + lVar9);
      auVar25._0_8_ = *pdVar2 * dVar5;
      auVar25._8_8_ = pdVar2[1] * dVar4;
      auVar25._16_8_ = pdVar2[2] * dVar5;
      auVar25._24_8_ = pdVar2[3] * dVar4;
      auVar22._0_8_ = *pdVar2 * dVar13;
      auVar22._8_8_ = pdVar2[1] * dVar14;
      auVar22._16_8_ = pdVar2[2] * dVar15;
      auVar22._24_8_ = pdVar2[3] * dVar16;
      auVar17 = vhsubpd_avx(auVar25,auVar22);
      auVar26._16_16_ = auVar12._0_16_;
      auVar26._0_16_ = auVar17._0_16_;
      auVar17 = vperm2f128_avx(auVar17,auVar12,0x31);
      *(undefined1 (*) [32])((long)&Xp->_M_real + lVar9 * 2) = auVar26;
      *(undefined1 (*) [32])((long)&Xp[1]._M_real + lVar9 * 2) = auVar17;
      lVar9 = lVar9 + 0x20;
      M = M + -1;
    } while (M != 0);
  }
  return;
}

Assistant:

void TPACK(const HAXX_INT M, const HAXX_INT N, T *X,
    const HAXX_INT LDX, T *Xp, Args... args) {
  
  
    // Sanity Checks
      

    static_assert( PK > 0, "Packing dimension must be non-zero" );      

    static_assert(
      (sizeof(typename PackOps::load_t) % sizeof(T)) == 0,
      "The size of the loaded variable must be an integer multiple of T" 
    );

    constexpr size_t NLOAD = sizeof(typename PackOps::load_t) / sizeof(T);

    static_assert(
      ( PK % NLOAD ) == 0,
      "The packing dimension must be an integer multiple of NLOAD"
    );

  
  
    HAXX_INT i,j;
  
  
    T *_x,*_x1,*_x2;
    T *_xp;
    
  
    _x  = X;
    _xp = Xp;
  
    auto alpha = PackOps::TypeWrapper::LoadScalar(args...);
  
  
    auto load_preOP = 
      overload(
        [&](auto &t){ 
          auto x = PackOps::TypeWrapper::Load(t);        
          return PackOps::preOP(x,alpha);
        },
        [&](){ 
          auto x = PackOps::TypeWrapper::Load();        
          return PackOps::preOP(x,alpha);
        }
      );
  
    auto ptrInc = [](auto &t){ return t + 1; };
  
    auto store = [](auto *&p, auto &t){ PackOps::TypeWrapper::Store(p,t);    };

    auto loopBody = [&](auto &xCol, auto *&xp) {

      for( i = 0; i < M; i++ ) {
  
        auto x   = apply_n<PK>( load_preOP, xCol );
        auto x_t = PackOps::OP(x);
  
        array_tuple_execute( store, xp, x_t );
  
        xCol = apply( ptrInc, xCol );
        xp += PK;
  
      }

    };
  
    j = N / PK;
    if( j > 0 )
    do {
  
      auto xCol = pointer_sequence<PK>(_x,LDX);
      _x += PK*LDX;

      loopBody(xCol,_xp);
      
      j--;
  
    } while(j > 0);
  

    j = N % PK;
    if( j ) {
  
      #ifdef _NDEBUG
        #undef _NDEBUG
        assert(j == 1 /* This has yet to be worked out */);
        #define _NDEBUG
      #else
        assert(j == 1 /* This has yet to be worked out */);
      #endif
  
      auto xCol = std::make_tuple(_x);
      loopBody(xCol,_xp);

    }
  
  }